

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O1

void tcg_out_shifti(TCGContext_conflict9 *s,int subopc,int reg,int count)

{
  byte *pbVar1;
  tcg_insn_unit *ptVar2;
  byte bVar3;
  
  bVar3 = ((byte)reg & 7) + (char)subopc * '\b' | 0xc0;
  if (count == 1) {
    tcg_out_opc(s,(subopc & 0xfffffff8U) + 0xd1,subopc & 7U,reg,0);
    count = (uint)bVar3;
  }
  else {
    tcg_out_opc(s,(subopc & 0xfffffff8U) + 0xc1,subopc & 7U,reg,0);
    pbVar1 = s->code_ptr;
    s->code_ptr = pbVar1 + 1;
    *pbVar1 = bVar3;
  }
  ptVar2 = s->code_ptr;
  s->code_ptr = ptVar2 + 1;
  *ptVar2 = (tcg_insn_unit)count;
  return;
}

Assistant:

static void tcg_out_shifti(TCGContext *s, int subopc, int reg, int count)
{
    /* Propagate an opcode prefix, such as P_DATA16.  */
    int ext = subopc & ~0x7;
    subopc &= 0x7;

    if (count == 1) {
        tcg_out_modrm(s, OPC_SHIFT_1 + ext, subopc, reg);
    } else {
        tcg_out_modrm(s, OPC_SHIFT_Ib + ext, subopc, reg);
        tcg_out8(s, count);
    }
}